

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O2

Hop_Obj_t * Kit_TruthToHop(Hop_Man_t *pMan,uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_00;
  Hop_Obj_t *pHVar1;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = Vec_IntAlloc((int)pMan);
    pGraph = Kit_TruthToGraph(pTruth,nVars,vMemory_00);
    Vec_IntFree(vMemory_00);
  }
  else {
    pGraph = Kit_TruthToGraph(pTruth,nVars,vMemory);
  }
  if (pGraph == (Kit_Graph_t *)0x0) {
    puts("Kit_TruthToHop(): Converting truth table to AIG has failed for function:");
    Kit_DsdPrintFromTruth(pTruth,nVars);
    putchar(10);
  }
  pHVar1 = Kit_GraphToHop(pMan,pGraph);
  Kit_GraphFree(pGraph);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Hop_Obj_t * pObj;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    if ( pGraph == NULL )
    {
        printf( "Kit_TruthToHop(): Converting truth table to AIG has failed for function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    }
    // derive the AIG for the decomposition tree
    pObj = Kit_GraphToHop( pMan, pGraph );
    Kit_GraphFree( pGraph );
    return pObj;
}